

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# own_as_range.hpp
# Opt level: O3

iterator_range<burst::owning_iterator<std::forward_list<int,_std::allocator<int>_>_>_> * __thiscall
burst::own_as_range_t::operator()
          (iterator_range<burst::owning_iterator<std::forward_list<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,own_as_range_t *this,
          forward_list<int,_std::allocator<int>_> *container)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_> local_40;
  owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  _Fwd_list_node_base *local_18;
  
  local_40.m_container.
  super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_40.m_container.
   super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_40.m_container.
   super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_40.m_container.
   super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003a47b8
  ;
  local_18 = (container->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
  local_40.m_container.
  super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_18;
  local_40.m_container.
  super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_40.m_container.
            super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
  (container->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next =
       (_Fwd_list_node_base *)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_40.m_container.
     super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count =
         (local_40.m_container.
          super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_40.m_container.
     super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = 2;
  }
  local_40.m_iterator._M_node = (_Fwd_list_node_base *)0x0;
  local_28 = (owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *)
             local_40.m_container.
             super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_20 = local_40.m_container.
             super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  boost::make_iterator_range<burst::owning_iterator<std::forward_list<int,std::allocator<int>>>>
            (__return_storage_ptr__,(boost *)&local_28,&local_40,
             (owning_iterator<std::forward_list<int,_std::allocator<int>_>_> *)
             local_40.m_container.
             super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  if (local_40.m_container.
      super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m_container.
               super___shared_ptr<std::forward_list<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container && container) const
        {
            auto begin = make_owning_iterator(std::forward<Container>(container));
            auto end = make_owning_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }